

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O3

int detect_form(archive_read *a,int *is_form_d)

{
  int iVar1;
  byte *b;
  size_t sVar2;
  void *pvVar3;
  void *pvVar4;
  ssize_t sVar5;
  byte *pbVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  size_t avail_00;
  byte bVar10;
  ulong uVar11;
  size_t sVar12;
  size_t sVar13;
  size_t sVar14;
  bool bVar15;
  ssize_t avail;
  ssize_t nl;
  int local_60;
  int local_5c;
  size_t local_58;
  int local_4c;
  ulong local_48;
  archive_read *local_40;
  int *local_38;
  
  if (is_form_d != (int *)0x0) {
    *is_form_d = 0;
  }
  local_40 = a;
  b = (byte *)__archive_read_ahead(a,1,(ssize_t *)&local_58);
  if (b == (byte *)0x0) {
    iVar1 = -1;
  }
  else {
    local_5c = 0;
    local_4c = 0;
    local_60 = 0;
    sVar13 = local_58;
    local_38 = is_form_d;
LAB_00158478:
    avail_00 = local_58;
    if (local_58 == 0) {
      local_48 = 0;
      sVar2 = 0;
LAB_001584ac:
      sVar12 = sVar13;
      sVar14 = avail_00;
      if (sVar2 == avail_00) {
        while( true ) {
          uVar11 = (ulong)((int)sVar12 + 0x3ffU & 0xfffffc00);
          pvVar3 = __archive_read_ahead
                             (local_40,uVar11 << (uVar11 < sVar12 + 0xa0),(ssize_t *)&local_58);
          pvVar4 = pvVar3;
          if (pvVar3 == (void *)0x0) {
            if ((long)local_58 <= (long)sVar12) {
              sVar2 = 0;
              goto LAB_00158884;
            }
            pvVar4 = __archive_read_ahead(local_40,local_58,(ssize_t *)&local_58);
          }
          sVar13 = local_58;
          b = (byte *)((long)pvVar4 + (sVar12 - sVar14));
          avail_00 = local_58 - (sVar12 - sVar14);
          local_58 = avail_00;
          sVar5 = get_line_size((char *)b,avail_00,(ssize_t *)&local_48);
          sVar2 = 0;
          if (-1 < sVar5) {
            sVar2 = sVar14;
          }
          sVar2 = sVar2 + sVar5;
          if (local_48 != 0) break;
          if ((pvVar3 == (void *)0x0) || (sVar12 = sVar13, sVar14 = avail_00, sVar2 != avail_00))
          goto LAB_00158884;
        }
        goto LAB_0015856c;
      }
    }
    else {
      sVar2 = get_line_size((char *)b,local_58,(ssize_t *)&local_48);
      if (local_48 == 0) goto LAB_001584ac;
LAB_0015856c:
      uVar11 = local_48;
      if ((long)sVar2 < 1) goto LAB_00158884;
      if (local_4c != 0) {
        iVar1 = bid_keyword_list((char *)b,sVar2,0,0);
        if (iVar1 < 1) {
          sVar2 = 1;
          goto LAB_00158884;
        }
        b = b + sVar2;
        if ((b[~uVar11] != 0x5c) && (bVar15 = local_4c == 1, local_4c = 0, bVar15)) {
          if (1 < local_5c) goto LAB_00158898;
          local_5c = local_5c + 1;
          local_4c = 0;
        }
        local_58 = avail_00 - sVar2;
        goto LAB_00158478;
      }
      pbVar6 = b + sVar2;
      do {
        bVar10 = *b;
        if ((bVar10 != 0x20) && (bVar10 != 9)) {
          bVar15 = true;
          goto LAB_00158613;
        }
        b = b + 1;
        avail_00 = avail_00 - 1;
        bVar15 = 1 < (long)sVar2;
        sVar2 = sVar2 - 1;
        local_58 = avail_00;
      } while (bVar15);
      bVar10 = *pbVar6;
      sVar2 = 0;
      bVar15 = false;
      b = pbVar6;
LAB_00158613:
      if (0x22 < bVar10) {
        if (bVar10 != 0x23) {
          if (bVar10 != 0x2f) goto LAB_0015868c;
          iVar1 = strncmp((char *)b,"/set",4);
          if (iVar1 == 0) {
            pbVar6 = b + 4;
            lVar7 = sVar2 - 4;
            iVar1 = 0;
          }
          else {
            iVar1 = strncmp((char *)b,"/unset",6);
            if (iVar1 != 0) goto LAB_00158884;
            pbVar6 = b + 6;
            lVar7 = sVar2 - 6;
            iVar1 = 1;
          }
          iVar1 = bid_keyword_list((char *)pbVar6,lVar7,iVar1,0);
          if (iVar1 < 1) goto LAB_00158884;
          local_4c = (uint)(b[~uVar11 + sVar2] == 0x5c) * 2;
LAB_00158866:
          b = b + sVar2;
          local_58 = avail_00 - sVar2;
          goto LAB_00158478;
        }
LAB_0015862c:
        b = b + sVar2;
        local_58 = avail_00 - sVar2;
        goto LAB_00158478;
      }
      if ((bVar10 == 10) || (bVar10 == 0xd)) goto LAB_0015862c;
LAB_0015868c:
      if (!bVar15) {
LAB_0015872b:
        lVar7 = -local_48 + sVar2;
        if ((((b + -local_48 + sVar2 + -2 < b) || (b[lVar7 + -1] != 0x5c)) ||
            ((bVar10 = b[-local_48 + sVar2 + -2], bVar10 != 9 && (bVar10 != 0x20)))) &&
           ((b <= b + lVar7 + -1 && (bVar10 = b[lVar7 + -1], bVar10 != 0x5c)))) {
          lVar7 = sVar2 - local_48;
          bVar15 = false;
          uVar8 = 0;
          while( true ) {
            if ((bVar10 == 9) || (bVar10 == 0x20)) goto LAB_001587cd;
            if (bid_entry_safe_char[bVar10] == '\0') goto LAB_00158884;
            if (bVar10 == 0x2f) {
              bVar15 = true;
            }
            if (b + lVar7 + -2 < b) break;
            bVar10 = b[lVar7 + -2];
            lVar7 = lVar7 + -1;
            uVar8 = uVar8 + 1;
          }
          lVar7 = lVar7 + -1;
          uVar8 = uVar8 + 1;
LAB_001587cd:
          if (((uVar8 != 0) && (bVar15)) && (b[lVar7] != 0x2f)) {
            sVar12 = sVar2 - (uVar8 + local_48);
            iVar1 = 1;
            bVar15 = false;
            pbVar6 = b;
            goto LAB_001587fe;
          }
        }
        goto LAB_00158884;
      }
      iVar1 = 0;
      pbVar6 = b;
      sVar12 = sVar2;
      do {
        uVar9 = (ulong)*pbVar6;
        if ((uVar9 < 0x21) && ((0x100002600U >> (uVar9 & 0x3f) & 1) != 0)) {
          if (iVar1 == 0) goto LAB_0015872b;
          iVar1 = 0;
          bVar15 = true;
          goto LAB_001587fe;
        }
        if (bid_entry_safe_char[uVar9] == '\0') goto LAB_0015872b;
        pbVar6 = pbVar6 + 1;
        iVar1 = iVar1 + -1;
        bVar15 = 1 < (long)sVar12;
        sVar12 = sVar12 - 1;
      } while (bVar15);
      iVar1 = 0;
      bVar15 = true;
      sVar12 = 0;
      pbVar6 = b + sVar2;
LAB_001587fe:
      iVar1 = bid_keyword_list((char *)pbVar6,sVar12,0,iVar1);
      if (-1 < iVar1) {
        if (local_60 == 1) {
          if ((bool)(bVar15 & iVar1 != 0)) {
            local_60 = 1;
            goto LAB_00158884;
          }
LAB_0015883e:
          if (bVar15) {
LAB_00158842:
            local_4c = 1;
            if (b[~uVar11 + sVar2] == 0x5c) goto LAB_00158866;
          }
        }
        else {
          if (local_60 != 0) goto LAB_0015883e;
          local_60 = 1;
          if (bVar15) {
            local_60 = -(uint)(iVar1 != 0);
            goto LAB_00158842;
          }
        }
        if (local_5c < 2) {
          local_5c = local_5c + 1;
          local_4c = 0;
          goto LAB_00158866;
        }
        goto LAB_00158898;
      }
    }
LAB_00158884:
    if (local_5c < 3) {
      if (local_5c < 1) {
        return 0;
      }
      if (sVar2 != 0) {
        return 0;
      }
    }
LAB_00158898:
    iVar1 = 0x20;
    if ((local_38 != (int *)0x0) && (local_60 == 1)) {
      *local_38 = 1;
    }
  }
  return iVar1;
}

Assistant:

static int
detect_form(struct archive_read *a, int *is_form_d)
{
	const char *p;
	ssize_t avail, ravail;
	ssize_t detected_bytes = 0, len, nl;
	int entry_cnt = 0, multiline = 0;
	int form_D = 0;/* The archive is generated by `NetBSD mtree -D'
			* (In this source we call it `form D') . */

	if (is_form_d != NULL)
		*is_form_d = 0;
	p = __archive_read_ahead(a, 1, &avail);
	if (p == NULL)
		return (-1);
	ravail = avail;
	for (;;) {
		len = next_line(a, &p, &avail, &ravail, &nl);
		/* The terminal character of the line should be
		 * a new line character, '\r\n' or '\n'. */
		if (len <= 0 || nl == 0)
			break;
		if (!multiline) {
			/* Leading whitespace is never significant,
			 * ignore it. */
			while (len > 0 && (*p == ' ' || *p == '\t')) {
				++p;
				--avail;
				--len;
			}
			/* Skip comment or empty line. */ 
			if (p[0] == '#' || p[0] == '\n' || p[0] == '\r') {
				p += len;
				avail -= len;
				continue;
			}
		} else {
			/* A continuance line; the terminal
			 * character of previous line was '\' character. */
			if (bid_keyword_list(p, len, 0, 0) <= 0)
				break;
			if (multiline == 1)
				detected_bytes += len;
			if (p[len-nl-1] != '\\') {
				if (multiline == 1 &&
				    ++entry_cnt >= MAX_BID_ENTRY)
					break;
				multiline = 0;
			}
			p += len;
			avail -= len;
			continue;
		}
		if (p[0] != '/') {
			int last_is_path, keywords;

			keywords = bid_entry(p, len, nl, &last_is_path);
			if (keywords >= 0) {
				detected_bytes += len;
				if (form_D == 0) {
					if (last_is_path)
						form_D = 1;
					else if (keywords > 0)
						/* This line is not `form D'. */
						form_D = -1;
				} else if (form_D == 1) {
					if (!last_is_path && keywords > 0)
						/* This this is not `form D'
						 * and We cannot accept mixed
						 * format. */
						break;
				}
				if (!last_is_path && p[len-nl-1] == '\\')
					/* This line continues. */
					multiline = 1;
				else {
					/* We've got plenty of correct lines
					 * to assume that this file is a mtree
					 * format. */
					if (++entry_cnt >= MAX_BID_ENTRY)
						break;
				}
			} else
				break;
		} else if (strncmp(p, "/set", 4) == 0) {
			if (bid_keyword_list(p+4, len-4, 0, 0) <= 0)
				break;
			/* This line continues. */
			if (p[len-nl-1] == '\\')
				multiline = 2;
		} else if (strncmp(p, "/unset", 6) == 0) {
			if (bid_keyword_list(p+6, len-6, 1, 0) <= 0)
				break;
			/* This line continues. */
			if (p[len-nl-1] == '\\')
				multiline = 2;
		} else
			break;

		/* Test next line. */
		p += len;
		avail -= len;
	}
	if (entry_cnt >= MAX_BID_ENTRY || (entry_cnt > 0 && len == 0)) {
		if (is_form_d != NULL) {
			if (form_D == 1)
				*is_form_d = 1;
		}
		return (32);
	}

	return (0);
}